

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_frozen_view(char *buf,size_t length)

{
  uint8_t uVar1;
  roaring_bitmap_t *prVar2;
  void **ppvVar3;
  uint *puVar4;
  int *piVar5;
  ulong in_RSI;
  ulong in_RDI;
  array_container_t *array;
  run_container_t *run;
  bitset_container_t *bitset;
  int32_t i_1;
  roaring_bitmap_t *rb;
  char *arena;
  size_t alloc_size;
  uint16_t *array_zone;
  rle16_t *run_zone;
  uint64_t *bitset_zone;
  int32_t i;
  size_t array_zone_size;
  size_t run_zone_size;
  size_t bitset_zone_size;
  int32_t num_array_containers;
  int32_t num_run_containers;
  int32_t num_bitset_containers;
  uint8_t *typecodes;
  uint16_t *counts;
  uint16_t *keys;
  int32_t num_containers;
  uint32_t header;
  int local_9c;
  char *local_90;
  long local_88;
  long local_80;
  long local_78;
  ulong local_70;
  int local_64;
  long local_60;
  long local_58;
  long local_50;
  int local_44;
  int local_40;
  int local_3c;
  uint8_t *local_38;
  long local_30;
  uint16_t *local_28;
  uint local_20;
  uint local_1c;
  roaring_bitmap_t *local_8;
  
  if ((in_RDI & 0x1f) == 0) {
    if (in_RSI < 4) {
      local_8 = (roaring_bitmap_t *)0x0;
    }
    else {
      local_1c = *(uint *)((in_RDI - 4) + in_RSI);
      if ((local_1c & 0x7fff) == 0x35c6) {
        local_20 = local_1c >> 0xf;
        if (in_RSI < (long)(int)local_20 * 5 + 4U) {
          local_8 = (roaring_bitmap_t *)0x0;
        }
        else {
          local_28 = (uint16_t *)((in_RDI + in_RSI + -4) - (long)(int)(local_20 * 5));
          local_30 = (in_RDI + in_RSI + -4) - (long)(int)(local_20 * 3);
          local_38 = (uint8_t *)((in_RDI + in_RSI + -4) - (long)(int)local_20);
          local_3c = 0;
          local_40 = 0;
          local_44 = 0;
          local_50 = 0;
          local_58 = 0;
          local_60 = 0;
          for (local_64 = 0; local_64 < (int)local_20; local_64 = local_64 + 1) {
            uVar1 = local_38[local_64];
            if (uVar1 == '\x01') {
              local_3c = local_3c + 1;
              local_50 = local_50 + 0x2000;
            }
            else if (uVar1 == '\x02') {
              local_44 = local_44 + 1;
              local_60 = (ulong)(*(ushort *)(local_30 + (long)local_64 * 2) + 1) * 2 + local_60;
            }
            else {
              if (uVar1 != '\x03') {
                return (roaring_bitmap_t *)0x0;
              }
              local_40 = local_40 + 1;
              local_58 = (ulong)*(ushort *)(local_30 + (long)local_64 * 2) * 4 + local_58;
            }
          }
          if (in_RSI == local_50 + local_58 + local_60 + (long)(int)(local_20 * 5) + 4U) {
            local_78 = in_RDI + local_50;
            local_80 = in_RDI + local_50 + local_58;
            local_88 = (long)local_44 * 0x10 +
                       (long)local_40 * 0x10 +
                       (long)local_3c * 0x10 + (long)(int)local_20 * 8 + 0x28;
            local_70 = in_RDI;
            local_90 = (char *)roaring_malloc(0x1156d9);
            if (local_90 == (char *)0x0) {
              local_8 = (roaring_bitmap_t *)0x0;
            }
            else {
              prVar2 = (roaring_bitmap_t *)arena_alloc(&local_90,0x28);
              (prVar2->high_low_container).flags = '\x02';
              (prVar2->high_low_container).allocation_size = local_20;
              (prVar2->high_low_container).size = local_20;
              (prVar2->high_low_container).keys = local_28;
              (prVar2->high_low_container).typecodes = local_38;
              ppvVar3 = (void **)arena_alloc(&local_90,(long)(int)local_20 << 3);
              (prVar2->high_low_container).containers = ppvVar3;
              for (local_9c = 0; local_8 = prVar2, local_9c < (int)local_20; local_9c = local_9c + 1
                  ) {
                uVar1 = local_38[local_9c];
                if (uVar1 == '\x01') {
                  piVar5 = (int *)arena_alloc(&local_90,0x10);
                  *(ulong *)(piVar5 + 2) = local_70;
                  *piVar5 = *(ushort *)(local_30 + (long)local_9c * 2) + 1;
                  (prVar2->high_low_container).containers[local_9c] = piVar5;
                  local_70 = local_70 + 0x2000;
                }
                else if (uVar1 == '\x02') {
                  piVar5 = (int *)arena_alloc(&local_90,0x10);
                  piVar5[1] = *(ushort *)(local_30 + (long)local_9c * 2) + 1;
                  *piVar5 = *(ushort *)(local_30 + (long)local_9c * 2) + 1;
                  *(long *)(piVar5 + 2) = local_80;
                  (prVar2->high_low_container).containers[local_9c] = piVar5;
                  local_80 = local_80 + (ulong)(*(ushort *)(local_30 + (long)local_9c * 2) + 1) * 2;
                }
                else {
                  if (uVar1 != '\x03') {
                    roaring_free((void *)0x11595c);
                    return (roaring_bitmap_t *)0x0;
                  }
                  puVar4 = (uint *)arena_alloc(&local_90,0x10);
                  puVar4[1] = (uint)*(ushort *)(local_30 + (long)local_9c * 2);
                  *puVar4 = (uint)*(ushort *)(local_30 + (long)local_9c * 2);
                  *(long *)(puVar4 + 2) = local_78;
                  (prVar2->high_low_container).containers[local_9c] = puVar4;
                  local_78 = local_78 + (long)(int)*puVar4 * 4;
                }
              }
            }
          }
          else {
            local_8 = (roaring_bitmap_t *)0x0;
          }
        }
      }
      else {
        local_8 = (roaring_bitmap_t *)0x0;
      }
    }
  }
  else {
    local_8 = (roaring_bitmap_t *)0x0;
  }
  return local_8;
}

Assistant:

const roaring_bitmap_t *roaring_bitmap_frozen_view(const char *buf,
                                                   size_t length) {
    if ((uintptr_t)buf % 32 != 0) {
        return NULL;
    }

    // cookie and num_containers
    if (length < 4) {
        return NULL;
    }
    uint32_t header;
    memcpy(&header, buf + length - 4, 4);  // header may be misaligned
    if ((header & 0x7FFF) != FROZEN_COOKIE) {
        return NULL;
    }
    int32_t num_containers = (header >> 15);

    // typecodes, counts and keys
    if (length < 4 + (size_t)num_containers * (1 + 2 + 2)) {
        return NULL;
    }
    uint16_t *keys = (uint16_t *)(buf + length - 4 - num_containers * 5);
    uint16_t *counts = (uint16_t *)(buf + length - 4 - num_containers * 3);
    uint8_t *typecodes = (uint8_t *)(buf + length - 4 - num_containers * 1);

    // {bitset,array,run}_zone
    int32_t num_bitset_containers = 0;
    int32_t num_run_containers = 0;
    int32_t num_array_containers = 0;
    size_t bitset_zone_size = 0;
    size_t run_zone_size = 0;
    size_t array_zone_size = 0;
    for (int32_t i = 0; i < num_containers; i++) {
        switch (typecodes[i]) {
            case BITSET_CONTAINER_TYPE:
                num_bitset_containers++;
                bitset_zone_size +=
                    BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            case RUN_CONTAINER_TYPE:
                num_run_containers++;
                run_zone_size += counts[i] * sizeof(rle16_t);
                break;
            case ARRAY_CONTAINER_TYPE:
                num_array_containers++;
                array_zone_size += (counts[i] + UINT32_C(1)) * sizeof(uint16_t);
                break;
            default:
                return NULL;
        }
    }
    if (length != bitset_zone_size + run_zone_size + array_zone_size +
                      5 * num_containers + 4) {
        return NULL;
    }
    uint64_t *bitset_zone = (uint64_t *)(buf);
    rle16_t *run_zone = (rle16_t *)(buf + bitset_zone_size);
    uint16_t *array_zone = (uint16_t *)(buf + bitset_zone_size + run_zone_size);

    size_t alloc_size = 0;
    alloc_size += sizeof(roaring_bitmap_t);
    alloc_size += num_containers * sizeof(container_t *);
    alloc_size += num_bitset_containers * sizeof(bitset_container_t);
    alloc_size += num_run_containers * sizeof(run_container_t);
    alloc_size += num_array_containers * sizeof(array_container_t);

    char *arena = (char *)roaring_malloc(alloc_size);
    if (arena == NULL) {
        return NULL;
    }

    roaring_bitmap_t *rb =
        (roaring_bitmap_t *)arena_alloc(&arena, sizeof(roaring_bitmap_t));
    rb->high_low_container.flags = ROARING_FLAG_FROZEN;
    rb->high_low_container.allocation_size = num_containers;
    rb->high_low_container.size = num_containers;
    rb->high_low_container.keys = (uint16_t *)keys;
    rb->high_low_container.typecodes = (uint8_t *)typecodes;
    rb->high_low_container.containers = (container_t **)arena_alloc(
        &arena, sizeof(container_t *) * num_containers);
    // Ensure offset of high_low_container.containers is known distance used in
    // C++ wrapper. sizeof(roaring_bitmap_t) is used as it is the size of the
    // only allocation that precedes high_low_container.containers. If this is
    // changed (new allocation or changed order), this offset will also need to
    // be changed in the C++ wrapper.
    assert(rb ==
           (roaring_bitmap_t *)((char *)rb->high_low_container.containers -
                                sizeof(roaring_bitmap_t)));
    for (int32_t i = 0; i < num_containers; i++) {
        switch (typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                bitset_container_t *bitset = (bitset_container_t *)arena_alloc(
                    &arena, sizeof(bitset_container_t));
                bitset->words = bitset_zone;
                bitset->cardinality = counts[i] + UINT32_C(1);
                rb->high_low_container.containers[i] = bitset;
                bitset_zone += BITSET_CONTAINER_SIZE_IN_WORDS;
                break;
            }
            case RUN_CONTAINER_TYPE: {
                run_container_t *run = (run_container_t *)arena_alloc(
                    &arena, sizeof(run_container_t));
                run->capacity = counts[i];
                run->n_runs = counts[i];
                run->runs = run_zone;
                rb->high_low_container.containers[i] = run;
                run_zone += run->n_runs;
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                array_container_t *array = (array_container_t *)arena_alloc(
                    &arena, sizeof(array_container_t));
                array->capacity = counts[i] + UINT32_C(1);
                array->cardinality = counts[i] + UINT32_C(1);
                array->array = array_zone;
                rb->high_low_container.containers[i] = array;
                array_zone += counts[i] + UINT32_C(1);
                break;
            }
            default:
                roaring_free(arena);
                return NULL;
        }
    }

    return rb;
}